

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

unique_ptr<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>_> __thiscall
node::anon_unknown_2::MinerImpl::createNewBlock
          (MinerImpl *this,CScript *script_pub_key,BlockCreateOptions *options)

{
  long lVar1;
  Options *in_RSI;
  _Head_base<0UL,_interfaces::BlockTemplate_*,_false> in_RDI;
  long in_FS_OFFSET;
  CScript *in_stack_00000088;
  BlockAssembler *in_stack_00000090;
  Options assemble_options;
  BlockAssembler *in_stack_fffffffffffffe78;
  unique_ptr<node::(anonymous_namespace)::BlockTemplateImpl,_std::default_delete<node::(anonymous_namespace)::BlockTemplateImpl>_>
  *in_stack_fffffffffffffe80;
  ChainstateManager *in_stack_fffffffffffffe88;
  unique_ptr<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>_> *this_00;
  undefined8 in_stack_fffffffffffffea8;
  int line;
  char *in_stack_fffffffffffffeb0;
  ArgsManager **in_stack_fffffffffffffeb8;
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *__args;
  Options *options_00;
  ArgsManager *args;
  Options *in_stack_fffffffffffffef0;
  _Head_base<0UL,_interfaces::BlockTemplate_*,_false> in_stack_fffffffffffffef8;
  _Head_base<0UL,_node::CBlockTemplate_*,_false> in_stack_ffffffffffffff00;
  BlockAssembler *in_stack_ffffffffffffff08;
  
  line = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  options_00 = in_RSI;
  args = (ArgsManager *)in_RDI._M_head_impl;
  CFeeRate::CFeeRate<unsigned_int>((CFeeRate *)in_stack_fffffffffffffe78,0);
  inline_assertion_check<true,ArgsManager*&>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,line,(char *)in_RSI,
             (char *)in_RDI._M_head_impl);
  ApplyArgsManOptions(args,options_00);
  chainman((MinerImpl *)in_stack_fffffffffffffe78);
  ChainstateManager::ActiveChainstate(in_stack_fffffffffffffe88);
  (**(code **)(*(long *)&in_RSI->super_BlockCreateOptions + 0x50))();
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::get
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_fffffffffffffe78);
  __args = (unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
           &stack0xffffffffffffff00;
  BlockAssembler::BlockAssembler
            (in_stack_ffffffffffffff08,(Chainstate *)in_stack_ffffffffffffff00._M_head_impl,
             (CTxMemPool *)in_stack_fffffffffffffef8._M_head_impl,in_stack_fffffffffffffef0);
  BlockAssembler::CreateNewBlock(in_stack_00000090,in_stack_00000088);
  std::
  make_unique<node::(anonymous_namespace)::BlockTemplateImpl,std::unique_ptr<node::CBlockTemplate,std::default_delete<node::CBlockTemplate>>>
            (__args);
  this_00 = (unique_ptr<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>_>
             *)&stack0xfffffffffffffef8;
  std::unique_ptr<interfaces::BlockTemplate,std::default_delete<interfaces::BlockTemplate>>::
  unique_ptr<node::(anonymous_namespace)::BlockTemplateImpl,std::default_delete<node::(anonymous_namespace)::BlockTemplateImpl>,void>
            (this_00,in_stack_fffffffffffffe80);
  std::
  unique_ptr<node::(anonymous_namespace)::BlockTemplateImpl,_std::default_delete<node::(anonymous_namespace)::BlockTemplateImpl>_>
  ::~unique_ptr((unique_ptr<node::(anonymous_namespace)::BlockTemplateImpl,_std::default_delete<node::(anonymous_namespace)::BlockTemplateImpl>_>
                 *)this_00);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)this_00
            );
  BlockAssembler::~BlockAssembler(in_stack_fffffffffffffe78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<interfaces::BlockTemplate,_std::default_delete<interfaces::BlockTemplate>,_true,_true>
            )(tuple<interfaces::BlockTemplate_*,_std::default_delete<interfaces::BlockTemplate>_>)
             in_RDI._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<BlockTemplate> createNewBlock(const CScript& script_pub_key, const BlockCreateOptions& options) override
    {
        BlockAssembler::Options assemble_options{options};
        ApplyArgsManOptions(*Assert(m_node.args), assemble_options);
        return std::make_unique<BlockTemplateImpl>(BlockAssembler{chainman().ActiveChainstate(), context()->mempool.get(), assemble_options}.CreateNewBlock(script_pub_key));
    }